

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

void __thiscall re2::SparseArray<int>::SparseArray(SparseArray<int> *this,int max_size)

{
  pointer pIVar1;
  bool bVar2;
  int *piVar3;
  ulong uVar4;
  
  (this->dense_).
  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dense_).
  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dense_).
  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_size_ = max_size;
  uVar4 = 0xffffffffffffffff;
  if (-1 < max_size) {
    uVar4 = (long)max_size * 4;
  }
  piVar3 = (int *)operator_new__(uVar4);
  this->sparse_to_dense_ = piVar3;
  std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ::resize(&this->dense_,(long)max_size);
  bVar2 = RunningOnValgrind();
  if (bVar2 && 0 < max_size) {
    piVar3 = this->sparse_to_dense_;
    pIVar1 = (this->dense_).
             super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      piVar3[uVar4] = -0x54545455;
      pIVar1[uVar4].index_ = -0x54545455;
      uVar4 = uVar4 + 1;
    } while ((uint)max_size != uVar4);
  }
  this->size_ = 0;
  if (-1 < this->max_size_) {
    return;
  }
  __assert_fail("(size_) <= (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c5,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
}

Assistant:

SparseArray<Value>::SparseArray(int max_size) {
  max_size_ = max_size;
  sparse_to_dense_ = new int[max_size];
  dense_.resize(max_size);
  // Don't need to zero the new memory, but appease Valgrind.
  if (InitMemory()) {
    for (int i = 0; i < max_size; i++) {
      sparse_to_dense_[i] = 0xababababU;
      dense_[i].index_ = 0xababababU;
    }
  }
  size_ = 0;
  DebugCheckInvariants();
}